

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O3

bool __thiscall
ylt::metric::
dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::
my_equal::operator()
          (my_equal *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *s1,span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *s2)

{
  pointer pbVar1;
  pointer pbVar2;
  size_t __n;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  pbVar1 = s1->_M_ptr;
  pbVar2 = s2->_M_ptr;
  lVar6 = 0;
  bVar4 = true;
  do {
    while( true ) {
      __n = pbVar1[lVar6]._M_string_length;
      if (__n != pbVar2[lVar6]._M_string_length) {
        return false;
      }
      if (__n != 0) break;
      lVar6 = 1;
      bVar3 = !bVar4;
      bVar4 = false;
      if (bVar3) {
        return true;
      }
    }
    iVar5 = bcmp(pbVar1[lVar6]._M_dataplus._M_p,pbVar2[lVar6]._M_dataplus._M_p,__n);
    lVar6 = 1;
    bVar3 = (bool)(iVar5 == 0 & bVar4);
    bVar4 = false;
  } while (bVar3);
  return iVar5 == 0;
}

Assistant:

bool operator()(const std::span<const std::string, N>& s1,
                    const std::span<const std::string, N>& s2) const noexcept {
      if constexpr (N > 0) {
        for (int i = 0; i < N; ++i) {
          if (s1[i] != s2[i]) {
            return false;
          }
        }
      }
      return true;
    }